

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

Iterator __thiscall
axl::sl::
ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
::insertHead(ListBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>_>
             *this,RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *p)

{
  size_t *psVar1;
  RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *pRVar2;
  ListLink *link;
  
  pRVar2 = (this->super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>)
           .m_head;
  (p->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_prev =
       (ListLink *)0x0;
  (p->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_next =
       (ListLink *)pRVar2;
  if (pRVar2 == (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)0x0) {
    pRVar2 = (RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame> *)this;
  }
  (pRVar2->
  super_BinTreeNodeBase<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_unsigned_long,_axl::spy::ThreadState::Frame>
  ).super_MapEntry<unsigned_long,_axl::spy::ThreadState::Frame>.super_ListLink.m_prev =
       (ListLink *)p;
  (this->super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>).m_head =
       p;
  psVar1 = &(this->super_ListData<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>_>
            ).m_count;
  *psVar1 = *psVar1 + 1;
  return (IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
          )(IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::spy::ThreadState::Frame>,_axl::sl::ListLink>_>
            )p;
}

Assistant:

Iterator
	insertHead(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* headLink = Iterator::getLinkFromEntry(this->m_head);

		link->m_prev = NULL;
		link->m_next = headLink;

		if (headLink)
			headLink->m_prev = link;
		else
			this->m_tail = p;

		this->m_head = p;
		this->m_count++;

		return p;
	}